

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::UpdateOutputToSourceMap
          (cmLocalGenerator *this,string *byproduct,cmTarget *target,cmListFileBacktrace *bt,
          cmCommandOrigin origin)

{
  pointer ppVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>,_bool>
  pVar2;
  SourceEntry *current;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
  local_58;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>,_bool>
  pr;
  SourceEntry entry;
  cmCommandOrigin origin_local;
  cmListFileBacktrace *bt_local;
  cmTarget *target_local;
  string *byproduct_local;
  cmLocalGenerator *this_local;
  
  SourceEntry::SourceEntry((SourceEntry *)&pr.second);
  pr._8_8_ = target;
  pVar2 = std::
          unordered_map<std::__cxx11::string,cmLocalGenerator::SourceEntry,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmLocalGenerator::SourceEntry>>>
          ::emplace<std::__cxx11::string_const&,cmLocalGenerator::SourceEntry&>
                    ((unordered_map<std::__cxx11::string,cmLocalGenerator::SourceEntry,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmLocalGenerator::SourceEntry>>>
                      *)&this->OutputToSource,byproduct,(SourceEntry *)&pr.second);
  local_58._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
       ._M_cur;
  pr.first.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
  ._M_cur._0_1_ = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>
                           *)&local_58);
    if ((ppVar1->second).Sources.Target == (cmTarget *)0x0) {
      (ppVar1->second).Sources.Target = target;
    }
  }
  else {
    anon_unknown.dwarf_110329::CreateGeneratedSource(this,byproduct,Byproduct,origin,bt);
  }
  return;
}

Assistant:

void cmLocalGenerator::UpdateOutputToSourceMap(std::string const& byproduct,
                                               cmTarget* target,
                                               cmListFileBacktrace const& bt,
                                               cmCommandOrigin origin)
{
  SourceEntry entry;
  entry.Sources.Target = target;

  auto pr = this->OutputToSource.emplace(byproduct, entry);
  if (pr.second) {
    CreateGeneratedSource(*this, byproduct, OutputRole::Byproduct, origin, bt);
  } else {
    SourceEntry& current = pr.first->second;
    // Has the target already been set?
    if (!current.Sources.Target) {
      current.Sources.Target = target;
    } else {
      // Multiple custom commands/targets produce the same output (source file
      // or target).  See also comment in other UpdateOutputToSourceMap
      // overload.
      //
      // TODO: Warn the user about this case.
    }
  }
}